

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# katajainen.c
# Opt level: O2

void BoundaryPM(Node *(*lists) [2],Node *leaves,int numsymbols,NodePool *pool,int index)

{
  int iVar1;
  Node *pNVar2;
  Node *pNVar3;
  ulong uVar4;
  Node *pNVar5;
  ulong uVar6;
  int index_00;
  long lVar7;
  Node **ppNVar8;
  bool bVar9;
  
  lVar7 = (long)index;
  ppNVar8 = lists[lVar7] + 1;
  index_00 = index + -1;
  while( true ) {
    iVar1 = (*ppNVar8)->count;
    if ((lVar7 == 0) && (numsymbols <= iVar1)) {
      return;
    }
    pNVar2 = pool->next;
    pool->next = pNVar2 + 1;
    pNVar5 = *ppNVar8;
    (*(Node *(*) [2])(ppNVar8 + -1))[0] = pNVar5;
    *ppNVar8 = pNVar2;
    bVar9 = lVar7 == 0;
    lVar7 = lVar7 + -1;
    if (bVar9) break;
    pNVar3 = ppNVar8[-2];
    uVar6 = pNVar3->weight + *(long *)ppNVar8[-3];
    if ((iVar1 < numsymbols) && (uVar4 = leaves[iVar1].weight, uVar4 < uVar6)) {
      pNVar5 = pNVar5->tail;
LAB_001237e2:
      pNVar2->weight = uVar4;
      pNVar2->count = iVar1 + 1;
      pNVar2->tail = pNVar5;
      return;
    }
    pNVar2->weight = uVar6;
    pNVar2->count = iVar1;
    pNVar2->tail = pNVar3;
    BoundaryPM(lists,leaves,numsymbols,pool,index_00);
    ppNVar8 = ppNVar8 + -2;
    index_00 = index_00 + -1;
  }
  uVar4 = leaves[iVar1].weight;
  pNVar5 = (Node *)0x0;
  goto LAB_001237e2;
}

Assistant:

static void BoundaryPM(Node* (*lists)[2], Node* leaves, int numsymbols,
                       NodePool* pool, int index) {
  Node* newchain;
  Node* oldchain;
  int lastcount = lists[index][1]->count;  /* Count of last chain of list. */

  if (index == 0 && lastcount >= numsymbols) return;

  newchain = pool->next++;
  oldchain = lists[index][1];

  /* These are set up before the recursive calls below, so that there is a list
  pointing to the new node, to let the garbage collection know it's in use. */
  lists[index][0] = oldchain;
  lists[index][1] = newchain;

  if (index == 0) {
    /* New leaf node in list 0. */
    InitNode(leaves[lastcount].weight, lastcount + 1, 0, newchain);
  } else {
    size_t sum = lists[index - 1][0]->weight + lists[index - 1][1]->weight;
    if (lastcount < numsymbols && sum > leaves[lastcount].weight) {
      /* New leaf inserted in list, so count is incremented. */
      InitNode(leaves[lastcount].weight, lastcount + 1, oldchain->tail,
          newchain);
    } else {
      InitNode(sum, lastcount, lists[index - 1][1], newchain);
      /* Two lookahead chains of previous list used up, create new ones. */
      BoundaryPM(lists, leaves, numsymbols, pool, index - 1);
      BoundaryPM(lists, leaves, numsymbols, pool, index - 1);
    }
  }
}